

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServerTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSocketServerTests::TestsocketServerFixtureaccept::TestsocketServerFixtureaccept
          (TestsocketServerFixtureaccept *this)

{
  char *suiteName;
  TestsocketServerFixtureaccept *this_local;
  
  suiteName = SuiteSocketServerTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"accept",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/SocketServerTestCase.cpp"
             ,0x45);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TestsocketServerFixtureaccept_0045bdf0;
  return;
}

Assistant:

TEST_FIXTURE(socketServerFixture, accept)
{
  SocketServer object( 0 );
  socket_handle serverS1 = object.add( TestSettings::port, true, true );
  socket_handle clientS1 = createSocket( TestSettings::port, "127.0.0.1" );
  CHECK( clientS1 > 0 );
  process_sleep(0.1);
  socket_handle s1 = object.accept( serverS1 );
  CHECK( s1 >= 0 );
  object.block( *this );
  CHECK( object.numConnections() == 1 );

  socket_handle clientS2 = createSocket( TestSettings::port, "127.0.0.1" );
  CHECK( clientS2 > 0 );
  process_sleep(0.1);
  socket_handle s2 = object.accept( serverS1 );
  CHECK( s2 >= 0 );
  object.block( *this );
  CHECK( object.numConnections() == 2 );

  socket_handle clientS3 = createSocket( TestSettings::port, "127.0.0.1" );
  CHECK( clientS3 > 0 );
  process_sleep(0.1);
  socket_handle s3 = object.accept( serverS1 );
  CHECK( s3 >= 0 );
  object.block( *this );
  CHECK( object.numConnections() == 3 );

  SocketMonitor& monitor = object.getMonitor();
  CHECK( !monitor.drop( -1 ) );
  CHECK( object.numConnections() == 3 );
  CHECK( monitor.drop( s1 ) );
  CHECK( object.numConnections() == 2 );
  CHECK( monitor.drop( s2 ) );
  CHECK( object.numConnections() == 1 );
  CHECK( monitor.drop( s3 ) );
  CHECK( object.numConnections() == 0 );

  destroySocket( clientS1 );
  destroySocket( clientS2 );
  destroySocket( clientS3 );
}